

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O0

int Iso_ObjHash(Iso_Obj_t *pIso,int nBins)

{
  uint local_28;
  uint local_24;
  uint Value;
  uint i;
  uint *pArray;
  int nBins_local;
  Iso_Obj_t *pIso_local;
  
  local_28 = 0;
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    local_28 = Iso_ObjHash::BigPrimes[local_24] * *(int *)(&pIso->field_0x0 + (ulong)local_24 * 4) ^
               local_28;
  }
  return local_28 % (uint)nBins;
}

Assistant:

static inline int Iso_ObjHash( Iso_Obj_t * pIso, int nBins )
{
    static unsigned BigPrimes[8] = {12582917, 25165843, 50331653, 100663319, 201326611, 402653189, 805306457, 1610612741};
    unsigned * pArray = (unsigned *)pIso;
    unsigned i, Value = 0;
    assert( ISO_NUM_INTS < 8 );
    for ( i = 0; i < ISO_NUM_INTS; i++ )
        Value ^= BigPrimes[i] * pArray[i];
    return Value % nBins;
}